

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O0

bool __thiscall
TCLAP::ValueArg<unsigned_long>::processArg
          (ValueArg<unsigned_long> *this,int *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  reference pvVar4;
  CmdLineParseException *pCVar5;
  size_type sVar6;
  ArgParseException *pAVar7;
  string local_1b8 [39];
  allocator local_191;
  string local_190 [39];
  undefined1 local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  undefined1 local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  undefined1 local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [8];
  string value;
  string local_48 [8];
  string flag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  int *i_local;
  ValueArg<unsigned_long> *this_local;
  
  if ((((this->super_Arg)._ignoreable & 1U) == 0) || (bVar1 = Arg::ignoreRest(), !bVar1)) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(long)*i);
    bVar1 = Arg::_hasBlanks(&this->super_Arg,pvVar4);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(long)*i);
      std::__cxx11::string::string(local_48,(string *)pvVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"",&local_69);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      (*(this->super_Arg)._vptr_Arg[10])(this,local_48,local_68);
      uVar3 = (*(this->super_Arg)._vptr_Arg[6])(this,local_48);
      if ((uVar3 & 1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        if (((this->super_Arg)._alreadySet & 1U) != 0) {
          if (((this->super_Arg)._xorSet & 1U) == 0) {
            local_119 = 1;
            pCVar5 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_f0,"Argument already set!",&local_f1);
            (*(this->super_Arg)._vptr_Arg[7])(local_118);
            CmdLineParseException::CmdLineParseException(pCVar5,(string *)local_f0,local_118);
            local_119 = 0;
            __cxa_throw(pCVar5,&CmdLineParseException::typeinfo,
                        CmdLineParseException::~CmdLineParseException);
          }
          local_c9 = 1;
          pCVar5 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_a0,"Mutually exclusive argument already set!",&local_a1);
          (*(this->super_Arg)._vptr_Arg[7])(local_c8);
          CmdLineParseException::CmdLineParseException(pCVar5,(string *)local_a0,local_c8);
          local_c9 = 0;
          __cxa_throw(pCVar5,&CmdLineParseException::typeinfo,
                      CmdLineParseException::~CmdLineParseException);
        }
        cVar2 = Arg::delimiter();
        if ((cVar2 != ' ') &&
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_68,""), bVar1)) {
          local_169 = 1;
          pAVar7 = (ArgParseException *)__cxa_allocate_exception(0x68);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_140,"Couldn\'t find delimiter for this argument!",&local_141);
          (*(this->super_Arg)._vptr_Arg[7])(local_168);
          ArgParseException::ArgParseException(pAVar7,(string *)local_140,local_168);
          local_169 = 0;
          __cxa_throw(pAVar7,&ArgParseException::typeinfo,ArgParseException::~ArgParseException);
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_68,"");
        if (bVar1) {
          *i = *i + 1;
          uVar3 = *i;
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if (sVar6 <= uVar3) {
            pAVar7 = (ArgParseException *)__cxa_allocate_exception(0x68);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_190,"Missing a value for this argument!",&local_191);
            (*(this->super_Arg)._vptr_Arg[7])(local_1b8);
            ArgParseException::ArgParseException(pAVar7,(string *)local_190,local_1b8);
            __cxa_throw(pAVar7,&ArgParseException::typeinfo,ArgParseException::~ArgParseException);
          }
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(long)*i);
          _extractValue(this,pvVar4);
        }
        else {
          _extractValue(this,(string *)local_68);
        }
        (this->super_Arg)._alreadySet = true;
        Arg::_checkWithVisitor(&this->super_Arg);
        this_local._7_1_ = true;
      }
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_48);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ValueArg<T>::processArg(int *i, std::vector<std::string>& args)
{
    if ( _ignoreable && Arg::ignoreRest() )
		return false;

    if ( _hasBlanks( args[*i] ) )
		return false;

    std::string flag = args[*i];

    std::string value = "";
    trimFlag( flag, value );

    if ( argMatches( flag ) )
    {
        if ( _alreadySet )
		{
			if ( _xorSet )
				throw( CmdLineParseException(
				       "Mutually exclusive argument already set!", 
				                             toString()) );
			else
				throw( CmdLineParseException("Argument already set!", 
				                             toString()) );
		}

        if ( Arg::delimiter() != ' ' && value == "" )
			throw( ArgParseException( 
							"Couldn't find delimiter for this argument!",
                             toString() ) );

        if ( value == "" )
        {
            (*i)++;
            if ( static_cast<unsigned int>(*i) < args.size() ) 
				_extractValue( args[*i] );
            else
				throw( ArgParseException("Missing a value for this argument!",
                                                    toString() ) );
        }
        else
			_extractValue( value );
				
        _alreadySet = true;
        _checkWithVisitor();
        return true;
    }	
    else
		return false;
}